

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O0

adios2_error
adios2_set_memory_selection
          (adios2_variable *variable,size_t ndims,size_t *memory_start,size_t *memory_count)

{
  pair *ppVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  allocator_type *in_RDX;
  long in_RSI;
  pair *in_RDI;
  Dims memoryCountV;
  Dims memoryStartV;
  VariableBase *variableBase;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffe40;
  pointer *__a;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *this;
  allocator_type *__last;
  pointer *__first;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  string *in_stack_fffffffffffffef8;
  adios2_variable *in_stack_ffffffffffffff00;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_f1;
  pair *local_b8;
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_28;
  allocator_type *local_20;
  long local_18;
  pair *local_10;
  adios2_error local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_48,"for adios2_variable, in call to adios2_set_memory_selection",&local_49);
  adios2::helper::CheckForNullptr<adios2_variable>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_80,"for start, in call to adios2_set_memory_selection",&local_81);
  adios2::helper::CheckForNullptr<unsigned_long_const>
            ((unsigned_long *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  this_00 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,"for count, in call to adios2_set_memory_selection",&local_a9);
  adios2::helper::CheckForNullptr<unsigned_long_const>
            ((unsigned_long *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  local_b8 = local_10;
  __last = local_20 + local_18 * 8;
  __first = &local_f1.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x16943f);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long_const*,void>
            (this_00,(unsigned_long *)__first,(unsigned_long *)__last,local_20);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x16946a);
  __a = &(local_28->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_start + local_18;
  this = &local_f1;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x16949a);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long_const*,void>
            (this_00,(unsigned_long *)__first,(unsigned_long *)__last,local_20);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1694c5);
  ppVar1 = local_b8;
  std::
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
            (this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a,local_28);
  adios2::core::VariableBase::SetMemorySelection(ppVar1);
  std::
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::~pair(in_stack_fffffffffffffe40);
  local_4 = adios2_error_none;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(local_28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(local_28);
  return local_4;
}

Assistant:

adios2_error adios2_set_memory_selection(adios2_variable *variable, const size_t ndims,
                                         const size_t *memory_start, const size_t *memory_count)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call to "
                                                  "adios2_set_memory_selection");
        adios2::helper::CheckForNullptr(memory_start, "for start, in call to "
                                                      "adios2_set_memory_selection");
        adios2::helper::CheckForNullptr(memory_count, "for count, in call to "
                                                      "adios2_set_memory_selection");
        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);

        const adios2::Dims memoryStartV(memory_start, memory_start + ndims);
        const adios2::Dims memoryCountV(memory_count, memory_count + ndims);
        variableBase->SetMemorySelection({memoryStartV, memoryCountV});
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_set_memory_selection"));
    }
}